

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void __thiscall rcg::Buffer::~Buffer(Buffer *this)

{
  bool bVar1;
  long in_RDI;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x40));
  if (bVar1) {
    std::__shared_ptr_access<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x125990);
    GenApi_3_4::CChunkAdapter::DetachBuffer();
  }
  std::shared_ptr<GenApi_3_4::CChunkAdapter>::~shared_ptr
            ((shared_ptr<GenApi_3_4::CChunkAdapter> *)0x1259aa);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1259b8);
  std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x1259c6);
  return;
}

Assistant:

Buffer::~Buffer()
{
  if (chunkadapter)
  {
    chunkadapter->DetachBuffer();
  }
}